

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O1

void __thiscall
Assimp::FBX::FBXConverter::GenerateNodeAnimations
          (FBXConverter *this,vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *node_anims,
          string *fixed_name,
          vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
          *curves,LayerMap *layer_map,int64_t start,int64_t stop,double *max_time,double *min_time)

{
  uint uVar1;
  pointer ppAVar2;
  iterator __position;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> *pvVar3;
  vector<aiNodeAnim*,std::allocator<aiNodeAnim*>> *this_00;
  bool bVar4;
  bool bVar5;
  AnimationCurveMap *pAVar6;
  vector<Assimp::FBX::AnimationCurveNode_const*,std::allocator<Assimp::FBX::AnimationCurveNode_const*>>
  *this_01;
  long lVar7;
  char *pcVar8;
  iterator iVar9;
  mapped_type *pmVar10;
  aiNodeAnim *paVar11;
  Model *extraout_RDX;
  Model *extraout_RDX_00;
  Model *extraout_RDX_01;
  bool bVar12;
  pointer ppAVar13;
  bool bVar14;
  iterator iVar15;
  TransformationComp TVar16;
  uint uVar17;
  Object *pOVar18;
  AnimationCurveNode *pAVar19;
  AnimationCurveNode *pAVar20;
  _Base_ptr p_Var21;
  aiNodeAnim *na;
  FBXConverter *local_2a0;
  AnimationCurveNode *node;
  undefined1 local_288 [16];
  aiNodeAnim *inv;
  vector<aiNodeAnim*,std::allocator<aiNodeAnim*>> *local_270;
  NodeMap node_property_map;
  const_iterator chain [17];
  aiNodeAnim *nd;
  
  node_property_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &node_property_map._M_t._M_impl.super__Rb_tree_header._M_header;
  node_property_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  node_property_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  node_property_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  ppAVar13 = (curves->
             super__Vector_base<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  ppAVar2 = (curves->
            super__Vector_base<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  local_270 = (vector<aiNodeAnim*,std::allocator<aiNodeAnim*>> *)node_anims;
  node_property_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       node_property_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (ppAVar2 == ppAVar13) {
    __assert_fail("curves.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                  ,0xa92,
                  "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                 );
  }
  bVar5 = this->doc->settings->strictMode;
  pOVar18 = (Object *)0x0;
  do {
    pAVar19 = *ppAVar13;
    if (pOVar18 == (Object *)0x0) {
      pOVar18 = pAVar19->target;
    }
    if (pAVar19->target != pOVar18) {
      LogFunctions<Assimp::FBXImporter>::LogWarn((char *)0x17e001);
    }
    if ((bVar5 != false) && (pAVar19->target != pOVar18)) {
      __assert_fail("node->Target() == target",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                    ,0xa81,
                    "void Assimp::FBX::validateAnimCurveNodes(const std::vector<const AnimationCurveNode *> &, bool)"
                   );
    }
    ppAVar13 = ppAVar13 + 1;
  } while (ppAVar13 != ppAVar2);
  ppAVar13 = (curves->
             super__Vector_base<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  ppAVar2 = (curves->
            super__Vector_base<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  pAVar19 = (AnimationCurveNode *)0x0;
  if (ppAVar13 != ppAVar2) {
    pAVar20 = pAVar19;
    do {
      pAVar19 = *ppAVar13;
      node = pAVar19;
      if (pAVar19 == (AnimationCurveNode *)0x0) {
        __assert_fail("node",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                      ,0xa99,
                      "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                     );
      }
      if ((pAVar19->prop)._M_string_length == 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)chain,
                       "target property for animation curve not set: ",&(pAVar19->super_Object).name
                      );
        Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
        basic_formatter<std::__cxx11::string>
                  ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&nd,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)chain);
        LogFunctions<Assimp::FBXImporter>::LogWarn((format *)&nd);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&nd);
        std::ios_base::~ios_base((ios_base *)&stack0xfffffffffffffec8);
        pAVar19 = pAVar20;
        if (chain[0]._M_node != (_Base_ptr)(chain + 2)) {
          operator_delete(chain[0]._M_node);
        }
      }
      else {
        pAVar6 = AnimationCurveNode::Curves_abi_cxx11_(pAVar19);
        if ((pAVar6->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)chain,
                         "no animation curves assigned to AnimationCurveNode: ",
                         &(node->super_Object).name);
          Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
          basic_formatter<std::__cxx11::string>
                    ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&nd,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)chain);
          LogFunctions<Assimp::FBXImporter>::LogWarn((format *)&nd);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&nd);
          std::ios_base::~ios_base((ios_base *)&stack0xfffffffffffffec8);
          if (chain[0]._M_node != (_Base_ptr)(chain + 2)) {
            operator_delete(chain[0]._M_node);
          }
        }
        else {
          this_01 = (vector<Assimp::FBX::AnimationCurveNode_const*,std::allocator<Assimp::FBX::AnimationCurveNode_const*>>
                     *)std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>_>
                       ::operator[](&node_property_map,&node->prop);
          __position._M_current = *(AnimationCurveNode ***)(this_01 + 8);
          if (__position._M_current == *(AnimationCurveNode ***)(this_01 + 0x10)) {
            std::
            vector<Assimp::FBX::AnimationCurveNode_const*,std::allocator<Assimp::FBX::AnimationCurveNode_const*>>
            ::_M_realloc_insert<Assimp::FBX::AnimationCurveNode_const*const&>
                      (this_01,__position,&node);
          }
          else {
            *__position._M_current = node;
            *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 8;
          }
        }
      }
      ppAVar13 = ppAVar13 + 1;
      pAVar20 = pAVar19;
    } while (ppAVar13 != ppAVar2);
  }
  if (pAVar19 == (AnimationCurveNode *)0x0) {
    __assert_fail("curve_node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                  ,0xaa9,
                  "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                 );
  }
  pOVar18 = pAVar19->target;
  if ((pOVar18 == (Object *)0x0) ||
     (lVar7 = __dynamic_cast(pOVar18,&Object::typeinfo,&Model::typeinfo,0), lVar7 == 0)) {
    __assert_fail("curve_node->TargetAsModel()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                  ,0xaaa,
                  "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                 );
  }
  if (pOVar18 == (Object *)0x0) {
    local_2a0 = (FBXConverter *)0x0;
  }
  else {
    local_2a0 = (FBXConverter *)__dynamic_cast(pOVar18,&Object::typeinfo,&Model::typeinfo,0);
  }
  paVar11 = (aiNodeAnim *)chain;
  bVar12 = false;
  iVar15._M_current = (aiNodeAnim **)0x0;
  memset(paVar11,0,0x88);
  pvVar3 = &local_2a0->meshes;
  lVar7 = 0;
  bVar14 = false;
  bVar5 = false;
  do {
    TVar16 = (TransformationComp)lVar7;
    if ((TVar16 & (TransformationComp_GeometricScaling|TransformationComp_ScalingPivot)) ==
        TransformationComp_RotationPivotInverse) {
      chain[lVar7]._M_node = &node_property_map._M_t._M_impl.super__Rb_tree_header._M_header;
    }
    else {
      pcVar8 = NameTransformationCompProperty((FBXConverter *)paVar11,TVar16);
      std::__cxx11::string::string((string *)&nd,pcVar8,(allocator *)&node);
      iVar15._M_current = &nd;
      iVar9 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>_>
              ::find(&node_property_map._M_t,(key_type *)&nd);
      chain[lVar7]._M_node = iVar9._M_node;
      paVar11 = nd;
      if (nd != (aiNodeAnim *)&stack0xfffffffffffffe68) {
        operator_delete(nd);
      }
      if ((_Rb_tree_header *)chain[lVar7]._M_node !=
          &node_property_map._M_t._M_impl.super__Rb_tree_header) {
        if ((this->doc->settings->optimizeEmptyAnimationCurves == true) &&
           (iVar15._M_current = (aiNodeAnim **)local_2a0,
           bVar4 = IsRedundantAnimationData
                             ((FBXConverter *)paVar11,(Model *)local_2a0,TVar16,
                              (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                               *)(chain[lVar7]._M_node + 2)), bVar4)) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&node,
                         "dropping redundant animation channel for node ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &(pvVar3->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
                          super__Vector_impl_data._M_finish);
          Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
          basic_formatter<std::__cxx11::string>
                    ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&nd,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&node);
          LogFunctions<Assimp::FBXImporter>::LogDebug((format *)&nd);
          iVar15._M_current = (aiNodeAnim **)&std::__cxx11::ostringstream::VTT;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&nd);
          std::ios_base::~ios_base((ios_base *)&stack0xfffffffffffffec8);
          paVar11 = (aiNodeAnim *)node;
          if (node != (AnimationCurveNode *)local_288) {
            operator_delete(node);
          }
        }
        else {
          bVar5 = bVar14;
          if ((TVar16 & (TransformationComp_GeometricScaling|TransformationComp_ScalingPivot)) !=
              TransformationComp_Translation) {
            bVar5 = true;
          }
          if (lVar7 == 0xc) {
            bVar5 = bVar14;
          }
          bVar12 = true;
          bVar14 = bVar5;
        }
      }
    }
    this_00 = local_270;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x11);
  if (bVar12) {
    if ((bVar5) ||
       (iVar15._M_current = (aiNodeAnim **)local_2a0,
       bVar5 = NeedsComplexTransformationChain((FBXConverter *)paVar11,(Model *)local_2a0), bVar5))
    {
      lVar7 = 0;
      uVar17 = 1;
      uVar1 = 0;
      do {
        p_Var21 = chain[lVar7]._M_node;
        if ((_Rb_tree_header *)p_Var21 != &node_property_map._M_t._M_impl.super__Rb_tree_header) {
          if (lVar7 == 0xd) {
            __assert_fail("comp != TransformationComp_ScalingPivotInverse",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                          ,0xafd,
                          "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                         );
          }
          if (lVar7 == 9) {
            __assert_fail("comp != TransformationComp_RotationPivotInverse",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                          ,0xafc,
                          "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                         );
          }
          TVar16 = (TransformationComp)lVar7;
          NameTransformationChainNode
                    ((string *)&nd,(FBXConverter *)iVar15._M_current,fixed_name,TVar16);
          na = (aiNodeAnim *)0x0;
          if (TransformationComp_GeometricScaling < TVar16) {
LAB_0017e8d2:
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                          ,0xb61,
                          "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                         );
          }
          uVar1 = uVar1 | uVar17;
          if ((0x4c38U >>
               (TVar16 & (TransformationComp_GeometricScaling|TransformationComp_GeometricRotation))
              & 1) == 0) {
            if ((0x81c0U >>
                 (TVar16 & (TransformationComp_GeometricScaling|TransformationComp_GeometricRotation
                           )) & 1) == 0) {
              if ((0x11000U >>
                   (TVar16 & (TransformationComp_GeometricScaling|
                             TransformationComp_GeometricRotation)) & 1) == 0) goto LAB_0017e8d2;
              iVar15._M_current = &nd;
              na = GenerateScalingNodeAnim
                             (this,(string *)iVar15._M_current,extraout_RDX,
                              (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                               *)(p_Var21 + 2),layer_map,start,stop,max_time,min_time);
            }
            else {
              iVar15._M_current = &nd;
              na = GenerateRotationNodeAnim
                             (this,(string *)iVar15._M_current,(Model *)local_2a0,
                              (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                               *)(p_Var21 + 2),layer_map,start,stop,max_time,min_time);
            }
          }
          else {
            p_Var21 = p_Var21 + 2;
            iVar15._M_current = &nd;
            na = GenerateTranslationNodeAnim
                           (this,(string *)iVar15._M_current,extraout_RDX,
                            (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                             *)p_Var21,layer_map,start,stop,max_time,min_time,false);
            if (lVar7 == 5) {
              NameTransformationChainNode
                        ((string *)&node,(FBXConverter *)iVar15._M_current,fixed_name,
                         TransformationComp_RotationPivotInverse);
              iVar15._M_current = (aiNodeAnim **)&node;
              paVar11 = GenerateTranslationNodeAnim
                                  (this,(string *)&node,extraout_RDX_00,
                                   (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                                    *)p_Var21,layer_map,start,stop,max_time,min_time,true);
              inv = paVar11;
              if (paVar11 == (aiNodeAnim *)0x0) {
                __assert_fail("inv",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                              ,0xb2e,
                              "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                             );
              }
              if (((paVar11->mNumPositionKeys == 0) && (paVar11->mNumRotationKeys == 0)) &&
                 (paVar11->mNumScalingKeys == 0)) {
                aiNodeAnim::~aiNodeAnim(paVar11);
                operator_delete(paVar11);
              }
              else {
                iVar15._M_current = *(aiNodeAnim ***)(this_00 + 8);
                if (iVar15._M_current == *(aiNodeAnim ***)(this_00 + 0x10)) {
                  std::vector<aiNodeAnim*,std::allocator<aiNodeAnim*>>::
                  _M_realloc_insert<aiNodeAnim*const&>(this_00,iVar15,&inv);
                }
                else {
                  *iVar15._M_current = paVar11;
                  *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
                }
              }
              if (node != (AnimationCurveNode *)local_288) {
                operator_delete(node);
              }
              uVar1 = uVar1 | uVar17 << 4;
            }
            else if (lVar7 == 0xb) {
              NameTransformationChainNode
                        ((string *)&node,(FBXConverter *)iVar15._M_current,fixed_name,
                         TransformationComp_ScalingPivotInverse);
              paVar11 = GenerateTranslationNodeAnim
                                  (this,(string *)&node,extraout_RDX_01,
                                   (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                                    *)p_Var21,layer_map,start,stop,max_time,min_time,true);
              inv = paVar11;
              if (paVar11 != (aiNodeAnim *)0x0) {
                if (((paVar11->mNumPositionKeys == 0) && (paVar11->mNumRotationKeys == 0)) &&
                   (paVar11->mNumScalingKeys == 0)) {
                  aiNodeAnim::~aiNodeAnim(paVar11);
                  operator_delete(paVar11);
                }
                else {
                  std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::push_back
                            ((vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *)local_270,&inv);
                }
                __assert_fail("TransformationComp_RotationPivotInverse > i",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                              ,0xb4e,
                              "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                             );
              }
              __assert_fail("inv",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                            ,0xb46,
                            "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                           );
            }
          }
          paVar11 = na;
          if (na == (aiNodeAnim *)0x0) {
            __assert_fail("na",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                          ,0xb64,
                          "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                         );
          }
          if (((na->mNumPositionKeys == 0) && (na->mNumRotationKeys == 0)) &&
             (na->mNumScalingKeys == 0)) {
            aiNodeAnim::~aiNodeAnim(na);
            operator_delete(paVar11);
          }
          else {
            iVar15._M_current = *(aiNodeAnim ***)(this_00 + 8);
            if (iVar15._M_current == *(aiNodeAnim ***)(this_00 + 0x10)) {
              std::vector<aiNodeAnim*,std::allocator<aiNodeAnim*>>::
              _M_realloc_insert<aiNodeAnim*const&>(this_00,iVar15,&na);
            }
            else {
              *iVar15._M_current = na;
              *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
            }
          }
          if (nd != (aiNodeAnim *)&stack0xfffffffffffffe68) {
            operator_delete(nd);
          }
        }
        lVar7 = lVar7 + 1;
        uVar17 = uVar17 * 2;
      } while (lVar7 != 0x11);
      pmVar10 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                ::operator[](&this->node_anim_chain_bits,fixed_name);
      *pmVar10 = uVar1;
    }
    else {
      paVar11 = GenerateSimpleNodeAnim
                          (this,fixed_name,(Model *)local_2a0,chain,
                           (const_iterator)&node_property_map._M_t._M_impl.super__Rb_tree_header,
                           layer_map,start,stop,max_time,min_time,true);
      nd = paVar11;
      if (paVar11 == (aiNodeAnim *)0x0) {
        __assert_fail("nd",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                      ,0xae6,
                      "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                     );
      }
      if (((paVar11->mNumPositionKeys == 0) && (paVar11->mNumRotationKeys == 0)) &&
         (paVar11->mNumScalingKeys == 0)) {
        aiNodeAnim::~aiNodeAnim(paVar11);
        operator_delete(paVar11);
      }
      else {
        iVar15._M_current = *(aiNodeAnim ***)(this_00 + 8);
        if (iVar15._M_current == *(aiNodeAnim ***)(this_00 + 0x10)) {
          std::vector<aiNodeAnim*,std::allocator<aiNodeAnim*>>::_M_realloc_insert<aiNodeAnim*const&>
                    (this_00,iVar15,&nd);
        }
        else {
          *iVar15._M_current = paVar11;
          *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
        }
      }
    }
  }
  else {
    LogFunctions<Assimp::FBXImporter>::LogWarn((char *)0x17e64b);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>_>
  ::~_Rb_tree(&node_property_map._M_t);
  return;
}

Assistant:

void FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim*>& node_anims,
            const std::string& fixed_name,
            const std::vector<const AnimationCurveNode*>& curves,
            const LayerMap& layer_map,
            int64_t start, int64_t stop,
            double& max_time,
            double& min_time)
        {

            NodeMap node_property_map;
            ai_assert(curves.size());

#ifdef ASSIMP_BUILD_DEBUG
            validateAnimCurveNodes(curves, doc.Settings().strictMode);
#endif
            const AnimationCurveNode* curve_node = NULL;
            for (const AnimationCurveNode* node : curves) {
                ai_assert(node);

                if (node->TargetProperty().empty()) {
                    FBXImporter::LogWarn("target property for animation curve not set: " + node->Name());
                    continue;
                }

                curve_node = node;
                if (node->Curves().empty()) {
                    FBXImporter::LogWarn("no animation curves assigned to AnimationCurveNode: " + node->Name());
                    continue;
                }

                node_property_map[node->TargetProperty()].push_back(node);
            }

            ai_assert(curve_node);
            ai_assert(curve_node->TargetAsModel());

            const Model& target = *curve_node->TargetAsModel();

            // check for all possible transformation components
            NodeMap::const_iterator chain[TransformationComp_MAXIMUM];

            bool has_any = false;
            bool has_complex = false;

            for (size_t i = 0; i < TransformationComp_MAXIMUM; ++i) {
                const TransformationComp comp = static_cast<TransformationComp>(i);

                // inverse pivots don't exist in the input, we just generate them
                if (comp == TransformationComp_RotationPivotInverse || comp == TransformationComp_ScalingPivotInverse) {
                    chain[i] = node_property_map.end();
                    continue;
                }

                chain[i] = node_property_map.find(NameTransformationCompProperty(comp));
                if (chain[i] != node_property_map.end()) {

                    // check if this curves contains redundant information by looking
                    // up the corresponding node's transformation chain.
                    if (doc.Settings().optimizeEmptyAnimationCurves &&
                        IsRedundantAnimationData(target, comp, (*chain[i]).second)) {

                        FBXImporter::LogDebug("dropping redundant animation channel for node " + target.Name());
                        continue;
                    }

                    has_any = true;

                    if (comp != TransformationComp_Rotation && comp != TransformationComp_Scaling && comp != TransformationComp_Translation)
                    {
                        has_complex = true;
                    }
                }
            }

            if (!has_any) {
                FBXImporter::LogWarn("ignoring node animation, did not find any transformation key frames");
                return;
            }

            // this needs to play nicely with GenerateTransformationNodeChain() which will
            // be invoked _later_ (animations come first). If this node has only rotation,
            // scaling and translation _and_ there are no animated other components either,
            // we can use a single node and also a single node animation channel.
            if (!has_complex && !NeedsComplexTransformationChain(target)) {

                aiNodeAnim* const nd = GenerateSimpleNodeAnim(fixed_name, target, chain,
                    node_property_map.end(),
                    layer_map,
                    start, stop,
                    max_time,
                    min_time,
                    true // input is TRS order, assimp is SRT
                );

                ai_assert(nd);
                if (nd->mNumPositionKeys == 0 && nd->mNumRotationKeys == 0 && nd->mNumScalingKeys == 0) {
                    delete nd;
                }
                else {
                    node_anims.push_back(nd);
                }
                return;
            }

            // otherwise, things get gruesome and we need separate animation channels
            // for each part of the transformation chain. Remember which channels
            // we generated and pass this information to the node conversion
            // code to avoid nodes that have identity transform, but non-identity
            // animations, being dropped.
            unsigned int flags = 0, bit = 0x1;
            for (size_t i = 0; i < TransformationComp_MAXIMUM; ++i, bit <<= 1) {
                const TransformationComp comp = static_cast<TransformationComp>(i);

                if (chain[i] != node_property_map.end()) {
                    flags |= bit;

                    ai_assert(comp != TransformationComp_RotationPivotInverse);
                    ai_assert(comp != TransformationComp_ScalingPivotInverse);

                    const std::string& chain_name = NameTransformationChainNode(fixed_name, comp);

                    aiNodeAnim* na = nullptr;
                    switch (comp)
                    {
                    case TransformationComp_Rotation:
                    case TransformationComp_PreRotation:
                    case TransformationComp_PostRotation:
                    case TransformationComp_GeometricRotation:
                        na = GenerateRotationNodeAnim(chain_name,
                            target,
                            (*chain[i]).second,
                            layer_map,
                            start, stop,
                            max_time,
                            min_time);

                        break;

                    case TransformationComp_RotationOffset:
                    case TransformationComp_RotationPivot:
                    case TransformationComp_ScalingOffset:
                    case TransformationComp_ScalingPivot:
                    case TransformationComp_Translation:
                    case TransformationComp_GeometricTranslation:
                        na = GenerateTranslationNodeAnim(chain_name,
                            target,
                            (*chain[i]).second,
                            layer_map,
                            start, stop,
                            max_time,
                            min_time);

                        // pivoting requires us to generate an implicit inverse channel to undo the pivot translation
                        if (comp == TransformationComp_RotationPivot) {
                            const std::string& invName = NameTransformationChainNode(fixed_name,
                                TransformationComp_RotationPivotInverse);

                            aiNodeAnim* const inv = GenerateTranslationNodeAnim(invName,
                                target,
                                (*chain[i]).second,
                                layer_map,
                                start, stop,
                                max_time,
                                min_time,
                                true);

                            ai_assert(inv);
                            if (inv->mNumPositionKeys == 0 && inv->mNumRotationKeys == 0 && inv->mNumScalingKeys == 0) {
                                delete inv;
                            }
                            else {
                                node_anims.push_back(inv);
                            }

                            ai_assert(TransformationComp_RotationPivotInverse > i);
                            flags |= bit << (TransformationComp_RotationPivotInverse - i);
                        }
                        else if (comp == TransformationComp_ScalingPivot) {
                            const std::string& invName = NameTransformationChainNode(fixed_name,
                                TransformationComp_ScalingPivotInverse);

                            aiNodeAnim* const inv = GenerateTranslationNodeAnim(invName,
                                target,
                                (*chain[i]).second,
                                layer_map,
                                start, stop,
                                max_time,
                                min_time,
                                true);

                            ai_assert(inv);
                            if (inv->mNumPositionKeys == 0 && inv->mNumRotationKeys == 0 && inv->mNumScalingKeys == 0) {
                                delete inv;
                            }
                            else {
                                node_anims.push_back(inv);
                            }

                            ai_assert(TransformationComp_RotationPivotInverse > i);
                            flags |= bit << (TransformationComp_RotationPivotInverse - i);
                        }

                        break;

                    case TransformationComp_Scaling:
                    case TransformationComp_GeometricScaling:
                        na = GenerateScalingNodeAnim(chain_name,
                            target,
                            (*chain[i]).second,
                            layer_map,
                            start, stop,
                            max_time,
                            min_time);

                        break;

                    default:
                        ai_assert(false);
                    }

                    ai_assert(na);
                    if (na->mNumPositionKeys == 0 && na->mNumRotationKeys == 0 && na->mNumScalingKeys == 0) {
                        delete na;
                    }
                    else {
                        node_anims.push_back(na);
                    }
                    continue;
                }
            }

            node_anim_chain_bits[fixed_name] = flags;
        }